

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O3

parser_error parse_vault_columns(parser *p)

{
  char *__s1;
  uint uVar1;
  int iVar2;
  parser_error pVar3;
  void *pvVar4;
  long lVar5;
  
  pvVar4 = parser_priv(p);
  if (pvVar4 == (void *)0x0) {
    pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    uVar1 = parser_getuint(p,"width");
    *(char *)((long)pvVar4 + 0x23) = (char)uVar1;
    __s1 = *(char **)((long)pvVar4 + 0x18);
    lVar5 = 0;
    do {
      iVar2 = strcmp(__s1,*(char **)((long)&room_builders[0].name + lVar5));
      if (iVar2 == 0) {
        if (*(int *)((long)&room_builders[0].max_width + lVar5) < (int)(uVar1 & 0xff)) {
          return PARSE_ERROR_VAULT_TOO_BIG;
        }
        return PARSE_ERROR_NONE;
      }
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x360);
    pVar3 = PARSE_ERROR_NO_ROOM_FOUND;
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_vault_columns(struct parser *p) {
	struct vault *v = parser_priv(p);
	size_t i;

	if (!v)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	v->wid = parser_getuint(p, "width");

	/* Make sure vaults are no wider than the room profiles allow. */
	for (i = 0; i < N_ELEMENTS(room_builders); i++)
		if (streq(v->typ, room_builders[i].name))
			break;
	if (i == N_ELEMENTS(room_builders))
		return PARSE_ERROR_NO_ROOM_FOUND;
	if (v->wid > room_builders[i].max_width)
		return PARSE_ERROR_VAULT_TOO_BIG;
	return PARSE_ERROR_NONE;
}